

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int star_oh(char *z)

{
  int iVar1;
  char *in_RDI;
  char *in_stack_ffffffffffffffe8;
  undefined1 local_9;
  
  iVar1 = isConsonant(in_stack_ffffffffffffffe8);
  local_9 = false;
  if ((((iVar1 != 0) && (local_9 = false, *in_RDI != 'w')) && (local_9 = false, *in_RDI != 'x')) &&
     (local_9 = false, *in_RDI != 'y')) {
    iVar1 = isVowel(in_stack_ffffffffffffffe8);
    local_9 = false;
    if (iVar1 != 0) {
      iVar1 = isConsonant(in_stack_ffffffffffffffe8);
      local_9 = iVar1 != 0;
    }
  }
  return (int)local_9;
}

Assistant:

static int star_oh(const char *z){
  return
    isConsonant(z) &&
    z[0]!='w' && z[0]!='x' && z[0]!='y' &&
    isVowel(z+1) &&
    isConsonant(z+2);
}